

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_cloud.hpp
# Opt level: O1

void ruckig::WaypointsCalculator<0ul,MinimalDynamicDofsVector>::
     vector_to_json<MinimalDynamicDofsVector<double,0ul>>
               (json *j,MinimalDynamicDofsVector<double,_0UL> *vector)

{
  ulong uVar1;
  _Map_pointer ppdVar2;
  _Map_pointer ppdVar3;
  _Elt_pointer pdVar4;
  vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  *this;
  number_float_t *pnVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  data local_58;
  data local_40;
  
  lVar9 = 0;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(j,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_40);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_40,false);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_40);
  this = nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::
         get_ref_impl<std::vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>&,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                   (j);
  ppdVar2 = (vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  std::
  vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::resize(this,((long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_last -
                 (long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur >> 3) +
                ((long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur -
                 (long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_first >> 3) +
                ((((ulong)((long)ppdVar2 -
                          (long)(vector->data).super__Deque_base<double,_std::allocator<double>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x40);
  lVar7 = 0;
  uVar10 = 0;
  while( true ) {
    ppdVar2 = (vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppdVar3 = (vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    pdVar4 = (vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (((long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_last - (long)pdVar4 >> 3) +
        ((long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)ppdVar2 - (long)ppdVar3) >> 3) - 1) + (ulong)(ppdVar2 == (_Map_pointer)0x0)
        ) * 0x40 <= uVar10) break;
    lVar6 = (long)pdVar4 -
            (long)(vector->data).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3;
    uVar1 = lVar6 + uVar10;
    if (uVar1 < 0x40) {
      pnVar5 = (number_float_t *)((long)pdVar4 + lVar9);
    }
    else {
      uVar8 = (uVar1 >> 6) + 0xfc00000000000000;
      if (0 < (long)uVar1) {
        uVar8 = uVar1 >> 6;
      }
      pnVar5 = ppdVar3[uVar8] + lVar6 + uVar8 * -0x40 + uVar10;
    }
    local_58.m_type = null;
    local_58._1_7_ = 0;
    local_58.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_58,*pnVar5);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_58,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(&(((this->
                       super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_data).m_type + lVar7),
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_58);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_58,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_58);
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 0x10;
    lVar9 = lVar9 + 8;
  }
  return;
}

Assistant:

static void vector_to_json(nlohmann::json& j, const V& vector) {
        j = nlohmann::json::array();
        auto& j_vector = j.get_ref<nlohmann::json::array_t&>();

        j_vector.resize(vector.size());
        for (size_t i = 0; i < vector.size(); ++i) {
            j_vector[i] = vector[i];
        }
    }